

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O0

pair<bool,_bool> __thiscall
chaiscript::dispatch::Dynamic_Proxy_Function::call_match_internal
          (Dynamic_Proxy_Function *this,Function_Params *vals,Type_Conversions_State *t_conversions)

{
  pair<bool,_bool> pVar1;
  bool local_4a;
  bool local_49;
  anon_class_24_3_3d35c925 local_48;
  pair<bool,_bool> local_2a;
  Type_Conversions_State *pTStack_28;
  pair<bool,_bool> comparison_result;
  Type_Conversions_State *t_conversions_local;
  Function_Params *vals_local;
  Dynamic_Proxy_Function *this_local;
  
  local_48.this = this;
  local_48.vals = vals;
  local_48.t_conversions = t_conversions;
  pTStack_28 = t_conversions;
  local_2a = call_match_internal::anon_class_24_3_3d35c925::operator()(&local_48);
  local_4a = false;
  if (((ushort)local_2a & 1) != 0) {
    local_4a = test_guard(this,vals,pTStack_28);
  }
  local_49 = local_4a;
  pVar1 = std::make_pair<bool,bool_const&>(&local_49,&local_2a.second);
  return pVar1;
}

Assistant:

std::pair<bool, bool> call_match_internal(const Function_Params &vals, const Type_Conversions_State &t_conversions) const {
        const auto comparison_result = [&]() {
          if (m_arity < 0) {
            return std::make_pair(true, false);
          } else if (vals.size() == size_t(m_arity)) {
            return m_param_types.match(vals, t_conversions);
          } else {
            return std::make_pair(false, false);
          }
        }();

        return std::make_pair(comparison_result.first && test_guard(vals, t_conversions), comparison_result.second);
      }